

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_2cfb1b::TargetTask::start(TargetTask *this,TaskInterface ti)

{
  pointer ppNVar1;
  uintptr_t inputID;
  pointer ppNVar2;
  TaskInterface local_80;
  string local_70 [32];
  string local_50 [32];
  
  local_80.ctx = ti.ctx;
  local_80.impl = ti.impl;
  ppNVar1 = (this->target->nodes).
            super__Vector_base<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  inputID = 0;
  for (ppNVar2 = (this->target->nodes).
                 super__Vector_base<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppNVar2 != ppNVar1;
      ppNVar2 = ppNVar2 + 1) {
    llbuild::buildsystem::BuildKey::makeNode((BuildKey *)local_70,*ppNVar2);
    std::__cxx11::string::string(local_50,local_70);
    llbuild::core::TaskInterface::request(&local_80,(KeyType *)local_50,inputID);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    inputID = (uintptr_t)((int)inputID + 1);
  }
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
    // Request all of the necessary system tasks.
    unsigned id = 0;
    for (auto it = target.getNodes().begin(),
           ie = target.getNodes().end(); it != ie; ++it, ++id) {
      ti.request(BuildKey::makeNode(*it).toData(), id);
    }
  }